

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# superGate.c
# Opt level: O2

Vec_Str_t *
Super_PrecomputeStr(Mio_Library_t *pLibGen,int nVarsMax,int nLevels,int nGatesMax,float tDelayMax,
                   float tAreaMax,int TimeLimit,int fSkipInv,int fVerbose)

{
  uint *puVar1;
  float *pfVar2;
  Super_Gate_t *pSVar3;
  Super_Gate_t_conflict *pSVar4;
  double dVar5;
  bool bVar6;
  bool bVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  Super_Man_t *pMan;
  Extra_MmFixed_t *pEVar11;
  stmm_table *psVar12;
  char *pcVar13;
  abctime aVar14;
  Super_Gate_t_conflict **ppSVar15;
  Super_Gate_t_conflict *pSVar16;
  ulong uVar17;
  abctime aVar18;
  stmm_generator *psVar19;
  abctime aVar20;
  long *__base;
  ulong uVar21;
  char *pcVar22;
  FILE *__s;
  char *pcVar23;
  Vec_Str_t *pVVar24;
  long lVar25;
  uint uVar26;
  ulong uVar27;
  ulong uVar28;
  ulong uVar29;
  long lVar30;
  Mio_Gate_t **ppMVar31;
  Super_Man_t *pSVar32;
  ulong uVar33;
  ulong uVar34;
  uint uVar35;
  ulong uVar36;
  uint uVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float local_1b0;
  float tPinDelayMax;
  ulong local_190;
  ulong local_188;
  ulong local_180;
  ulong local_178;
  ulong local_170;
  ulong local_168;
  ulong local_160;
  ulong local_158;
  long *local_150;
  float local_148;
  uint local_144;
  float local_140;
  float local_13c;
  Mio_Gate_t **local_138;
  ulong local_130;
  ProgressBar *local_128;
  uint local_120;
  int nGates;
  uint local_118 [2];
  undefined8 local_110;
  uint local_108;
  uint local_104;
  uint local_100;
  uint local_fc;
  uint local_f8;
  uint local_f4;
  uint local_f0;
  uint local_ec;
  int local_e4;
  uint uTruth [2];
  float *ptPinDelays [6];
  Super_Gate_t *pSupers [6];
  float tPinDelaysRes [6];
  
  local_e4 = fSkipInv;
  if (6 < nVarsMax) {
    __assert_fail("nVarsMax < 7",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/super/superGate.c"
                  ,0xb4,
                  "Vec_Str_t *Super_PrecomputeStr(Mio_Library_t *, int, int, int, float, float, int, int, int)"
                 );
  }
  if (nGatesMax < nVarsMax && nGatesMax != 0) {
    pVVar24 = (Vec_Str_t *)0x0;
    fprintf(_stderr,
            "Erro! The number of supergates requested (%d) in less than the number of variables (%d).\n"
            ,(ulong)(uint)nGatesMax,(ulong)(uint)nVarsMax);
    fwrite("The library cannot be computed.\n",0x20,1,_stderr);
  }
  else {
    local_120 = nLevels;
    local_138 = Mio_CollectRoots(pLibGen,nVarsMax,tDelayMax,0,&nGates,fVerbose);
    if ((nGatesMax != 0) && (nGatesMax <= nGates)) {
      fwrite("Warning! Genlib library contains more gates than can be computed.\n",0x42,1,_stdout);
      fwrite("Only one-gate supergates are included in the supergate library.\n",0x40,1,_stdout);
    }
    pMan = (Super_Man_t *)calloc(1,0xe8);
    pEVar11 = Extra_MmFixedStart(0x70);
    pMan->pMem = pEVar11;
    psVar12 = stmm_init_table(st__ptrcmp,st__ptrhash);
    pMan->tTable = psVar12;
    pcVar13 = Mio_LibraryReadName(pLibGen);
    pMan->pName = pcVar13;
    pMan->nGatesMax = nGatesMax;
    pMan->fSkipInv = local_e4;
    pMan->tDelayMax = tDelayMax;
    pMan->tAreaMax = tAreaMax;
    pMan->TimeLimit = TimeLimit;
    local_144 = nGatesMax;
    if (TimeLimit == 0) {
      aVar14 = 0;
    }
    else {
      aVar14 = Abc_Clock();
      aVar14 = aVar14 + (long)TimeLimit * 1000000;
    }
    ppMVar31 = local_138;
    pMan->TimeStop = aVar14;
    pMan->fVerbose = fVerbose;
    if (nGates == 0) {
      fwrite("Error: No genlib gates satisfy the limits criteria. Stop.\n",0x3a,1,_stderr);
      fprintf(_stderr,"Limits: max delay =  %.2f, max area =  %.2f, time limit = %d sec.\n",
              SUB84((double)pMan->tDelayMax,0),(double)pMan->tAreaMax,(ulong)(uint)pMan->TimeLimit);
      Super_ManStop(pMan);
      free(ppMVar31);
      pVVar24 = (Vec_Str_t *)0x0;
    }
    else {
      pMan->nVarsMax = nVarsMax;
      pMan->nMints = 1 << ((byte)nVarsMax & 0x1f);
      pMan->nLevels = 0;
      pMan->nGates = nVarsMax;
      ppSVar15 = (Super_Gate_t_conflict **)malloc((long)nVarsMax * 8 + 0x10);
      pMan->pGates = ppSVar15;
      uVar36 = 0;
      uVar28 = 0;
      if (0 < nVarsMax) {
        uVar28 = (ulong)(uint)nVarsMax;
      }
      for (; uVar37 = local_144, uVar36 != uVar28; uVar36 = uVar36 + 1) {
        pSVar16 = (Super_Gate_t_conflict *)Extra_MmFixedEntryFetch(pMan->pMem);
        pSVar16->pRoot = (Mio_Gate_t *)0x0;
        *(undefined8 *)&pSVar16->field_0x8 = 0;
        *(undefined8 *)(pSVar16->uTruth + 1) = 0;
        pSVar16->pFanins[0] = (Super_Gate_t *)0x0;
        pSVar16->pFanins[1] = (Super_Gate_t *)0x0;
        pSVar16->pFanins[2] = (Super_Gate_t *)0x0;
        pSVar16->pFanins[3] = (Super_Gate_t *)0x0;
        pSVar16->pFanins[4] = (Super_Gate_t *)0x0;
        pSVar16->pFanins[5] = (Super_Gate_t *)0x0;
        pSVar16->Area = 0.0;
        pSVar16->ptDelays[0] = 0.0;
        pSVar16->ptDelays[1] = 0.0;
        pSVar16->ptDelays[2] = 0.0;
        pSVar16->ptDelays[3] = 0.0;
        pSVar16->ptDelays[4] = 0.0;
        *(undefined8 *)(pSVar16->ptDelays + 5) = 0;
        pSVar16->pNext = (Super_Gate_t_conflict *)0x0;
        *(int *)&pSVar16->field_0x8 = (int)uVar36 * 0x100 + 1;
        for (uVar17 = 0; (uint)nVarsMax != uVar17; uVar17 = uVar17 + 1) {
          pSVar16->ptDelays[uVar17] = -9999.0;
        }
        pSVar16->ptDelays[uVar36] = 0.0;
        pMan->pGates[uVar36] = pSVar16;
        Super_AddGateToTable(pMan,pSVar16);
        pMan->pInputs[uVar36] = pSVar16;
      }
      uVar10 = 5;
      if (nVarsMax < 5) {
        uVar10 = nVarsMax;
      }
      uVar26 = 0;
      uVar36 = 0;
      if (0 < (int)uVar10) {
        uVar36 = (ulong)uVar10;
      }
      uVar35 = 1;
      for (; uVar26 >> ((byte)uVar10 & 0x1f) == 0; uVar26 = uVar26 + 1) {
        for (uVar17 = 0; uVar36 != uVar17; uVar17 = uVar17 + 1) {
          if ((uVar26 >> ((uint)uVar17 & 0x1f) & 1) != 0) {
            puVar1 = pMan->pGates[uVar17]->uTruth;
            *puVar1 = *puVar1 | 1 << ((byte)uVar26 & 0x1f);
          }
        }
      }
      if (nVarsMax == 6) {
        ppSVar15 = pMan->pGates;
        for (lVar25 = 0; lVar25 != 5; lVar25 = lVar25 + 1) {
          pSVar16 = ppSVar15[lVar25];
          pSVar16->uTruth[1] = pSVar16->uTruth[0];
        }
        pSVar16 = ppSVar15[5];
        pSVar16->uTruth[0] = 0;
        pSVar16->uTruth[1] = 0xffffffff;
      }
      else {
        for (uVar36 = 0; uVar28 != uVar36; uVar36 = uVar36 + 1) {
          pMan->pGates[uVar36]->uTruth[1] = 0;
        }
      }
      aVar14 = Abc_Clock();
      uVar10 = local_120;
      if (fVerbose != 0) {
        printf("Computing supergates with %d inputs, %d levels, and %d max gates.\n",
               (ulong)(uint)pMan->nVarsMax,(ulong)local_120,(ulong)uVar37);
        printf("Limits: max delay =  %.2f, max area =  %.2f, time limit = %d sec.\n",
               SUB84((double)pMan->tDelayMax,0),(ulong)(uint)pMan->TimeLimit);
      }
      if ((int)uVar10 < 1) {
        uVar10 = 0;
      }
      local_120 = uVar10 + 1;
      while( true ) {
        if ((uVar35 == local_120) ||
           ((pMan->TimeStop != 0 && (aVar18 = Abc_Clock(), pMan->TimeStop < aVar18)))) break;
        aVar18 = Abc_Clock();
        lVar25 = (long)nGates;
        free(pMan->pGates);
        ppSVar15 = (Super_Gate_t_conflict **)malloc((long)pMan->nAdded << 3);
        pMan->pGates = ppSVar15;
        pMan->nGates = 0;
        psVar19 = stmm_init_gen(pMan->tTable);
        while (iVar8 = stmm_gen(psVar19,(char **)ptPinDelays,(char **)pSupers), ppSVar15 = pSupers,
              iVar8 != 0) {
          while (pSVar16 = *ppSVar15, pSVar16 != (Super_Gate_t_conflict *)0x0) {
            iVar8 = pMan->nGates;
            pMan->nGates = iVar8 + 1;
            pMan->pGates[iVar8] = pSVar16;
            ppSVar15 = &pSVar16->pNext;
          }
        }
        stmm_free_gen(psVar19);
        iVar8 = pMan->nGates;
        if (10000 < iVar8) {
          printf("Sorting array of %d supergates...\r");
          fflush(_stdout);
          iVar8 = pMan->nGates;
        }
        qsort(pMan->pGates,(long)iVar8,8,Super_DelayCompare);
        fVar38 = (*pMan->pGates)->tDelayMax;
        pfVar2 = &pMan->pGates[(long)pMan->nGates + -1]->tDelayMax;
        if (*pfVar2 <= fVar38 && fVar38 != *pfVar2) {
          __assert_fail("Super_DelayCompare( pMan->pGates, pMan->pGates + pMan->nGates - 1 ) <= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/super/superGate.c"
                        ,0x175,
                        "Super_Man_t *Super_Compute(Super_Man_t *, Mio_Gate_t **, int, int, int)");
        }
        if (10000 < pMan->nGates) {
          printf("                                       \r");
        }
        local_128 = Extra_ProgressBarStart((FILE *)_stdout,pMan->TimeLimit);
        aVar20 = Abc_Clock();
        pMan->TimePrint = aVar20 + 1000000;
        __base = (long *)malloc((long)pMan->nGates << 3);
        lVar30 = 0;
        local_1b0 = 0.0;
        iVar8 = 0;
        local_150 = __base;
        while ((ppMVar31 = local_138, lVar30 < lVar25 && (iVar8 == 0))) {
          if (pMan->nLevels < 1) {
LAB_00377473:
            dVar5 = Mio_GateReadDelayMax(ppMVar31[lVar30]);
            uVar36 = 0;
            uVar28 = (ulong)(uint)pMan->nGates;
            if (pMan->nGates < 1) {
              uVar28 = uVar36;
            }
            uVar37 = 0;
            for (; uVar28 != uVar36; uVar36 = uVar36 + 1) {
              pSVar16 = pMan->pGates[uVar36];
              if ((pMan->nLevels < 1) || ((*(uint *)&pSVar16->field_0x8 & 0xfc) < 9)) {
                __base[(int)uVar37] = (long)pSVar16;
                uVar37 = uVar37 + 1;
                if ((pMan->tDelayMax < pSVar16->tDelayMax + (float)dVar5) && (0.0 < pMan->tDelayMax)
                   ) break;
              }
            }
            if (pMan->fVerbose != 0) {
              uVar10 = Mio_GateReadPinNum(ppMVar31[lVar30]);
              printf("Trying %d choices for %d inputs\r",(ulong)uVar37,(ulong)uVar10);
            }
            if (10000 < (int)uVar37) {
              printf("Sorting array of %d supergates...\r",(ulong)uVar37);
            }
            qsort(__base,(long)(int)uVar37,8,Super_AreaCompare);
            if (*(float *)(__base[(long)(int)uVar37 - 1] + 0x48) <= *(float *)(*__base + 0x48) &&
                *(float *)(*__base + 0x48) != *(float *)(__base[(long)(int)uVar37 - 1] + 0x48)) {
              __assert_fail("Super_AreaCompare( ppGatesLimit, ppGatesLimit + nGatesLimit - 1 ) <= 0"
                            ,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/super/superGate.c"
                            ,0x1ad,
                            "Super_Man_t *Super_Compute(Super_Man_t *, Mio_Gate_t **, int, int, int)"
                           );
            }
            if (10000 < (int)uVar37) {
              printf("                                       \r");
            }
            dVar5 = Mio_GateReadArea(ppMVar31[lVar30]);
            uVar10 = Mio_GateReadPinNum(ppMVar31[lVar30]);
            if (6 < uVar10) {
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/super/superGate.c"
                            ,0x2cc,
                            "Super_Man_t *Super_Compute(Super_Man_t *, Mio_Gate_t **, int, int, int)"
                           );
            }
            local_13c = (float)dVar5;
            uVar28 = (ulong)uVar37;
            local_168 = uVar28;
            switch(uVar10) {
            case 0:
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/super/superGate.c"
                            ,0x1b7,
                            "Super_Man_t *Super_Compute(Super_Man_t *, Mio_Gate_t **, int, int, int)"
                           );
            case 1:
              uVar28 = 0;
              local_178 = (ulong)uVar37;
              if ((int)uVar37 < 1) {
                local_178 = uVar28;
              }
              iVar8 = 0;
              while (((local_178 != uVar28 &&
                      (pSVar3 = (Super_Gate_t *)__base[uVar28], pSVar3 != (Super_Gate_t *)0x0)) &&
                     (iVar8 == 0))) {
                iVar8 = Super_CheckTimeout(local_128,pMan);
                ppMVar31 = local_138;
                if (((local_e4 == 0) || (pSVar3->tDelayMax != 0.0)) || (NAN(pSVar3->tDelayMax))) {
                  local_1b0 = pSVar3->Area + local_13c;
                  if ((0.0 < pMan->tAreaMax) && (pMan->tAreaMax < local_1b0)) break;
                  local_118 = *&pSVar3->uTruth;
                  ptPinDelays[0] = pSVar3->ptDelays;
                  local_168 = uVar28;
                  pSupers[0] = pSVar3;
                  Mio_DeriveGateDelays
                            (local_138[lVar30],ptPinDelays,1,pMan->nVarsMax,-9999.0,tPinDelaysRes,
                             &tPinDelayMax);
                  Mio_DeriveTruthTable(ppMVar31[lVar30],&local_118,1,pMan->nVarsMax,uTruth);
                  iVar9 = Super_CompareGates(pMan,uTruth,local_1b0,tPinDelaysRes,pMan->nVarsMax);
                  uVar28 = local_168;
                  if (iVar9 != 0) {
                    pSVar16 = Super_CreateGateNew(pMan,ppMVar31[lVar30],pSupers,1,uTruth,local_1b0,
                                                  tPinDelaysRes,tPinDelayMax,pMan->nVarsMax);
                    Super_AddGateToTable(pMan,pSVar16);
                    uVar28 = local_168;
                    if ((local_144 != 0) && ((int)local_144 < pMan->nClasses)) goto LAB_00378a57;
                  }
                }
                uVar28 = uVar28 + 1;
              }
              break;
            case 2:
              uVar36 = 0;
              uVar17 = (ulong)uVar37;
              if ((int)uVar37 < 1) {
                uVar17 = uVar36;
              }
              iVar8 = 0;
              local_178 = uVar17;
LAB_0037779b:
              if ((uVar36 != uVar17) &&
                 (pSVar3 = (Super_Gate_t *)__base[uVar36], pSVar3 != (Super_Gate_t *)0x0)) {
                fVar38 = pSVar3->Area + local_13c;
                if ((pMan->tAreaMax <= 0.0) || (fVar38 <= pMan->tAreaMax)) {
                  local_118 = *&pSVar3->uTruth;
                  ptPinDelays[0] = pSVar3->ptDelays;
                  uVar33 = 0;
                  local_170 = CONCAT44(local_170._4_4_,fVar38);
                  local_180 = uVar36;
                  pSupers[0] = pSVar3;
                  do {
                    if ((uVar28 == uVar33) ||
                       (pSVar3 = (Super_Gate_t *)__base[uVar33], pSVar3 == (Super_Gate_t *)0x0))
                    goto LAB_003779b3;
                    if (uVar36 != uVar33) {
                      if (iVar8 != 0) goto LAB_00378a57;
                      iVar8 = Super_CheckTimeout(local_128,pMan);
                      ppMVar31 = local_138;
                      local_1b0 = pSVar3->Area + (float)local_170;
                      if ((0.0 < pMan->tAreaMax) &&
                         (uVar36 = local_180, uVar17 = local_178, pMan->tAreaMax < local_1b0))
                      goto LAB_003779b3;
                      local_110 = *(undefined8 *)pSVar3->uTruth;
                      ptPinDelays[1] = pSVar3->ptDelays;
                      pSupers[1] = pSVar3;
                      Mio_DeriveGateDelays
                                (local_138[lVar30],ptPinDelays,2,pMan->nVarsMax,-9999.0,
                                 tPinDelaysRes,&tPinDelayMax);
                      Mio_DeriveTruthTable(ppMVar31[lVar30],&local_118,2,pMan->nVarsMax,uTruth);
                      iVar9 = Super_CompareGates(pMan,uTruth,local_1b0,tPinDelaysRes,pMan->nVarsMax)
                      ;
                      uVar36 = local_180;
                      __base = local_150;
                      uVar28 = local_168;
                      if (iVar9 != 0) {
                        pSVar16 = Super_CreateGateNew(pMan,ppMVar31[lVar30],pSupers,2,uTruth,
                                                      local_1b0,tPinDelaysRes,tPinDelayMax,
                                                      pMan->nVarsMax);
                        Super_AddGateToTable(pMan,pSVar16);
                        uVar36 = local_180;
                        __base = local_150;
                        uVar28 = local_168;
                        if ((local_144 != 0) && ((int)local_144 < pMan->nClasses))
                        goto LAB_00378a57;
                      }
                    }
                    uVar33 = uVar33 + 1;
                    uVar17 = local_178;
                  } while( true );
                }
              }
              break;
            case 3:
              uVar36 = 0;
              uVar17 = (ulong)uVar37;
              if ((int)uVar37 < 1) {
                uVar17 = uVar36;
              }
              iVar8 = 0;
              local_178 = uVar17;
              for (; (uVar36 != uVar17 &&
                     (pSVar3 = (Super_Gate_t *)__base[uVar36], pSVar3 != (Super_Gate_t *)0x0));
                  uVar36 = uVar36 + 1) {
                fVar38 = pSVar3->Area + local_13c;
                if ((0.0 < pMan->tAreaMax) && (pMan->tAreaMax < fVar38)) break;
                local_118 = *&pSVar3->uTruth;
                ptPinDelays[0] = pSVar3->ptDelays;
                uVar33 = 0;
                local_190 = CONCAT44(local_190._4_4_,fVar38);
                local_188 = uVar36;
                pSupers[0] = pSVar3;
                while( true ) {
                  if ((uVar33 == uVar28) ||
                     (pSVar3 = (Super_Gate_t *)__base[uVar33], pSVar3 == (Super_Gate_t *)0x0))
                  goto LAB_00378489;
                  if (uVar33 != uVar36) break;
LAB_0037846a:
                  uVar33 = uVar33 + 1;
                }
                fVar39 = pSVar3->Area + fVar38;
                if ((pMan->tAreaMax <= 0.0) || (fVar39 <= pMan->tAreaMax)) {
                  local_180 = CONCAT44(local_180._4_4_,fVar39);
                  local_110 = *(undefined8 *)pSVar3->uTruth;
                  ptPinDelays[1] = pSVar3->ptDelays;
                  uVar34 = 0;
                  local_170 = uVar33;
                  pSupers[1] = pSVar3;
                  do {
                    uVar17 = local_178;
                    if ((uVar28 == uVar34) ||
                       (pSVar3 = (Super_Gate_t *)__base[uVar34], pSVar3 == (Super_Gate_t *)0x0))
                    goto LAB_0037846a;
                    if (uVar33 != uVar34 && uVar36 != uVar34) {
                      if (iVar8 != 0) goto LAB_00378a57;
                      iVar8 = Super_CheckTimeout(local_128,pMan);
                      ppMVar31 = local_138;
                      local_1b0 = pSVar3->Area + (float)local_180;
                      if ((0.0 < pMan->tAreaMax) && (pMan->tAreaMax < local_1b0)) {
                        uVar33 = local_170;
                        uVar17 = local_178;
                        fVar38 = (float)local_190;
                        goto LAB_0037846a;
                      }
                      local_108 = pSVar3->uTruth[0];
                      local_104 = pSVar3->uTruth[1];
                      ptPinDelays[2] = pSVar3->ptDelays;
                      pSupers[2] = pSVar3;
                      Mio_DeriveGateDelays
                                (local_138[lVar30],ptPinDelays,3,pMan->nVarsMax,-9999.0,
                                 tPinDelaysRes,&tPinDelayMax);
                      Mio_DeriveTruthTable(ppMVar31[lVar30],&local_118,3,pMan->nVarsMax,uTruth);
                      iVar9 = Super_CompareGates(pMan,uTruth,local_1b0,tPinDelaysRes,pMan->nVarsMax)
                      ;
                      if (iVar9 != 0) {
                        pSVar16 = Super_CreateGateNew(pMan,ppMVar31[lVar30],pSupers,3,uTruth,
                                                      local_1b0,tPinDelaysRes,tPinDelayMax,
                                                      pMan->nVarsMax);
                        Super_AddGateToTable(pMan,pSVar16);
                        if (local_144 != 0) {
                          uVar33 = local_170;
                          __base = local_150;
                          uVar36 = local_188;
                          uVar28 = local_168;
                          fVar38 = (float)local_190;
                          if (pMan->nClasses <= (int)local_144) goto LAB_00378458;
                          goto LAB_00378a57;
                        }
                      }
                      uVar33 = local_170;
                      __base = local_150;
                      uVar36 = local_188;
                      uVar28 = local_168;
                      fVar38 = (float)local_190;
                    }
LAB_00378458:
                    uVar34 = uVar34 + 1;
                  } while( true );
                }
LAB_00378489:
              }
              break;
            case 4:
              uVar36 = 0;
              uVar17 = (ulong)uVar37;
              if ((int)uVar37 < 1) {
                uVar17 = uVar36;
              }
              iVar8 = 0;
              local_178 = uVar17;
LAB_00377e2c:
              if ((uVar36 != uVar17) &&
                 (pSVar3 = (Super_Gate_t *)__base[uVar36], pSVar3 != (Super_Gate_t *)0x0)) {
                fVar38 = pSVar3->Area + local_13c;
                if ((pMan->tAreaMax <= 0.0) || (fVar38 <= pMan->tAreaMax)) {
                  local_118 = *&pSVar3->uTruth;
                  ptPinDelays[0] = pSVar3->ptDelays;
                  uVar33 = 0;
                  local_160 = CONCAT44(local_160._4_4_,fVar38);
                  local_158 = uVar36;
                  pSupers[0] = pSVar3;
                  do {
                    if ((uVar33 == uVar28) ||
                       (pSVar3 = (Super_Gate_t *)__base[uVar33], pSVar3 == (Super_Gate_t *)0x0))
                    goto LAB_0037819d;
                    if (uVar33 != uVar36) {
                      fVar39 = pSVar3->Area + fVar38;
                      if ((0.0 < pMan->tAreaMax) && (pMan->tAreaMax < fVar39)) goto LAB_0037819d;
                      local_110 = *(undefined8 *)pSVar3->uTruth;
                      ptPinDelays[1] = pSVar3->ptDelays;
                      uVar34 = 0;
                      local_188 = CONCAT44(local_188._4_4_,fVar39);
                      local_190 = uVar33;
                      pSupers[1] = pSVar3;
                      while( true ) {
                        if ((uVar34 == uVar28) ||
                           (pSVar3 = (Super_Gate_t *)__base[uVar34], pSVar3 == (Super_Gate_t *)0x0))
                        goto LAB_00377eb2;
                        if (uVar34 != uVar33 && uVar34 != uVar36) break;
LAB_00378173:
                        uVar34 = uVar34 + 1;
                      }
                      fVar40 = pSVar3->Area + fVar39;
                      if ((pMan->tAreaMax <= 0.0) || (fVar40 <= pMan->tAreaMax)) {
                        local_170 = CONCAT44(local_170._4_4_,fVar40);
                        local_108 = pSVar3->uTruth[0];
                        local_104 = pSVar3->uTruth[1];
                        ptPinDelays[2] = pSVar3->ptDelays;
                        uVar27 = 0;
                        local_180 = uVar34;
                        pSupers[2] = pSVar3;
                        do {
                          uVar17 = local_178;
                          if ((uVar28 == uVar27) ||
                             (pSVar3 = (Super_Gate_t *)__base[uVar27], pSVar3 == (Super_Gate_t *)0x0
                             )) goto LAB_00378173;
                          if ((uVar34 != uVar27) && ((uVar36 != uVar27 && (uVar33 != uVar27)))) {
                            if (iVar8 != 0) goto LAB_00378a57;
                            iVar8 = Super_CheckTimeout(local_128,pMan);
                            ppMVar31 = local_138;
                            local_1b0 = pSVar3->Area + (float)local_170;
                            if ((0.0 < pMan->tAreaMax) && (pMan->tAreaMax < local_1b0)) {
                              uVar33 = local_190;
                              uVar34 = local_180;
                              uVar17 = local_178;
                              fVar38 = (float)local_160;
                              fVar39 = (float)local_188;
                              goto LAB_00378173;
                            }
                            local_100 = pSVar3->uTruth[0];
                            local_fc = pSVar3->uTruth[1];
                            ptPinDelays[3] = pSVar3->ptDelays;
                            pSupers[3] = pSVar3;
                            Mio_DeriveGateDelays
                                      (local_138[lVar30],ptPinDelays,4,pMan->nVarsMax,-9999.0,
                                       tPinDelaysRes,&tPinDelayMax);
                            Mio_DeriveTruthTable
                                      (ppMVar31[lVar30],&local_118,4,pMan->nVarsMax,uTruth);
                            iVar9 = Super_CompareGates(pMan,uTruth,local_1b0,tPinDelaysRes,
                                                       pMan->nVarsMax);
                            if (iVar9 != 0) {
                              pSVar16 = Super_CreateGateNew(pMan,ppMVar31[lVar30],pSupers,4,uTruth,
                                                            local_1b0,tPinDelaysRes,tPinDelayMax,
                                                            pMan->nVarsMax);
                              Super_AddGateToTable(pMan,pSVar16);
                              if (local_144 != 0) {
                                __base = local_150;
                                uVar33 = local_190;
                                uVar34 = local_180;
                                uVar36 = local_158;
                                uVar28 = local_168;
                                fVar38 = (float)local_160;
                                fVar39 = (float)local_188;
                                if (pMan->nClasses <= (int)local_144) goto LAB_00378161;
                                goto LAB_00378a57;
                              }
                            }
                            __base = local_150;
                            uVar33 = local_190;
                            uVar34 = local_180;
                            uVar36 = local_158;
                            uVar28 = local_168;
                            fVar38 = (float)local_160;
                            fVar39 = (float)local_188;
                          }
LAB_00378161:
                          uVar27 = uVar27 + 1;
                        } while( true );
                      }
                    }
LAB_00377eb2:
                    uVar33 = uVar33 + 1;
                  } while( true );
                }
              }
              break;
            case 5:
              uVar36 = 0;
              uVar17 = (ulong)uVar37;
              if ((int)uVar37 < 1) {
                uVar17 = uVar36;
              }
              iVar8 = 0;
              local_178 = uVar17;
              for (; (uVar36 != uVar17 &&
                     (pSVar3 = (Super_Gate_t *)__base[uVar36], pSVar3 != (Super_Gate_t *)0x0));
                  uVar36 = uVar36 + 1) {
                fVar38 = pSVar3->Area + local_13c;
                if ((0.0 < pMan->tAreaMax) && (pMan->tAreaMax < fVar38)) break;
                local_118 = *&pSVar3->uTruth;
                ptPinDelays[0] = pSVar3->ptDelays;
                uVar33 = 0;
                local_158 = CONCAT44(local_158._4_4_,fVar38);
                local_130 = uVar36;
                pSupers[0] = pSVar3;
                while( true ) {
                  if ((uVar33 == uVar28) ||
                     (pSVar3 = (Super_Gate_t *)__base[uVar33], pSVar3 == (Super_Gate_t *)0x0))
                  goto LAB_00377e13;
                  if (uVar33 != uVar36) break;
LAB_00377a5a:
                  uVar33 = uVar33 + 1;
                }
                fVar39 = pSVar3->Area + fVar38;
                if ((pMan->tAreaMax <= 0.0) || (fVar39 <= pMan->tAreaMax)) {
                  local_110 = *(undefined8 *)pSVar3->uTruth;
                  ptPinDelays[1] = pSVar3->ptDelays;
                  uVar34 = 0;
                  local_160 = uVar33;
                  local_148 = fVar39;
                  pSupers[1] = pSVar3;
                  do {
                    if ((uVar34 == uVar28) ||
                       (pSVar3 = (Super_Gate_t *)__base[uVar34], pSVar3 == (Super_Gate_t *)0x0))
                    goto LAB_00377a5a;
                    if (uVar34 != uVar33 && uVar34 != uVar36) {
                      fVar40 = pSVar3->Area + fVar39;
                      if ((0.0 < pMan->tAreaMax) && (pMan->tAreaMax < fVar40)) goto LAB_00377a5a;
                      local_108 = pSVar3->uTruth[0];
                      local_104 = pSVar3->uTruth[1];
                      ptPinDelays[2] = pSVar3->ptDelays;
                      uVar27 = 0;
                      local_188 = CONCAT44(local_188._4_4_,fVar40);
                      fVar39 = local_148;
                      local_190 = uVar34;
                      pSupers[2] = pSVar3;
                      while( true ) {
                        if ((uVar27 == uVar28) ||
                           (pSVar3 = (Super_Gate_t *)__base[uVar27], pSVar3 == (Super_Gate_t *)0x0))
                        goto LAB_00377ad3;
                        if ((uVar27 != uVar34) && ((uVar27 != uVar36 && (uVar27 != uVar33)))) break;
LAB_00377dcd:
                        uVar27 = uVar27 + 1;
                      }
                      fVar41 = pSVar3->Area + fVar40;
                      if ((pMan->tAreaMax <= 0.0) || (fVar39 = local_148, fVar41 <= pMan->tAreaMax))
                      {
                        local_180 = CONCAT44(local_180._4_4_,fVar41);
                        local_100 = pSVar3->uTruth[0];
                        local_fc = pSVar3->uTruth[1];
                        ptPinDelays[3] = pSVar3->ptDelays;
                        uVar21 = 0;
                        local_170 = uVar27;
                        pSupers[3] = pSVar3;
                        do {
                          uVar17 = local_178;
                          fVar39 = local_148;
                          if ((uVar28 == uVar21) ||
                             (pSVar3 = (Super_Gate_t *)__base[uVar21], pSVar3 == (Super_Gate_t *)0x0
                             )) goto LAB_00377dcd;
                          if ((uVar27 != uVar21) &&
                             (((uVar34 != uVar21 && (uVar36 != uVar21)) && (uVar33 != uVar21)))) {
                            if (iVar8 != 0) goto LAB_00378a57;
                            iVar8 = Super_CheckTimeout(local_128,pMan);
                            ppMVar31 = local_138;
                            local_1b0 = pSVar3->Area + (float)local_180;
                            if ((0.0 < pMan->tAreaMax) && (pMan->tAreaMax < local_1b0)) {
                              uVar27 = local_170;
                              uVar33 = local_160;
                              uVar34 = local_190;
                              uVar17 = local_178;
                              fVar39 = local_148;
                              fVar38 = (float)local_158;
                              fVar40 = (float)local_188;
                              goto LAB_00377dcd;
                            }
                            local_f8 = pSVar3->uTruth[0];
                            local_f4 = pSVar3->uTruth[1];
                            ptPinDelays[4] = pSVar3->ptDelays;
                            pSupers[4] = pSVar3;
                            Mio_DeriveGateDelays
                                      (local_138[lVar30],ptPinDelays,5,pMan->nVarsMax,-9999.0,
                                       tPinDelaysRes,&tPinDelayMax);
                            Mio_DeriveTruthTable
                                      (ppMVar31[lVar30],&local_118,5,pMan->nVarsMax,uTruth);
                            iVar9 = Super_CompareGates(pMan,uTruth,local_1b0,tPinDelaysRes,
                                                       pMan->nVarsMax);
                            if (iVar9 != 0) {
                              pSVar16 = Super_CreateGateNew(pMan,ppMVar31[lVar30],pSupers,5,uTruth,
                                                            local_1b0,tPinDelaysRes,tPinDelayMax,
                                                            pMan->nVarsMax);
                              Super_AddGateToTable(pMan,pSVar16);
                              if (local_144 != 0) {
                                uVar27 = local_170;
                                __base = local_150;
                                uVar33 = local_160;
                                uVar34 = local_190;
                                uVar36 = local_130;
                                uVar28 = local_168;
                                fVar38 = (float)local_158;
                                fVar40 = (float)local_188;
                                if (pMan->nClasses <= (int)local_144) goto LAB_00377db2;
                                goto LAB_00378a57;
                              }
                            }
                            uVar27 = local_170;
                            __base = local_150;
                            uVar33 = local_160;
                            uVar34 = local_190;
                            uVar36 = local_130;
                            uVar28 = local_168;
                            fVar38 = (float)local_158;
                            fVar40 = (float)local_188;
                          }
LAB_00377db2:
                          uVar21 = uVar21 + 1;
                        } while( true );
                      }
                    }
LAB_00377ad3:
                    uVar34 = uVar34 + 1;
                  } while( true );
                }
LAB_00377e13:
              }
              break;
            case 6:
              uVar36 = 0;
              uVar17 = (ulong)uVar37;
              if ((int)uVar37 < 1) {
                uVar17 = uVar36;
              }
              iVar8 = 0;
              local_178 = uVar17;
LAB_003784a1:
              if ((uVar36 != uVar17) &&
                 (pSVar3 = (Super_Gate_t *)__base[uVar36], pSVar3 != (Super_Gate_t *)0x0)) {
                fVar38 = pSVar3->Area + local_13c;
                if ((pMan->tAreaMax <= 0.0) || (fVar38 <= pMan->tAreaMax)) {
                  local_118 = *&pSVar3->uTruth;
                  ptPinDelays[0] = pSVar3->ptDelays;
                  uVar33 = 0;
                  local_130 = CONCAT44(local_130._4_4_,fVar38);
                  local_158 = uVar36;
                  pSupers[0] = pSVar3;
                  do {
                    if ((uVar33 == uVar28) ||
                       (pSVar3 = (Super_Gate_t *)__base[uVar33], pSVar3 == (Super_Gate_t *)0x0))
                    goto LAB_00378a42;
                    if (uVar33 != uVar36) {
                      fVar39 = pSVar3->Area + fVar38;
                      if ((0.0 < pMan->tAreaMax) && (pMan->tAreaMax < fVar39)) goto LAB_00378a42;
                      local_110 = *(undefined8 *)pSVar3->uTruth;
                      ptPinDelays[1] = pSVar3->ptDelays;
                      uVar34 = 0;
                      local_160 = uVar33;
                      local_140 = fVar39;
                      pSupers[1] = pSVar3;
                      while( true ) {
                        if ((uVar34 == uVar28) ||
                           (pSVar3 = (Super_Gate_t *)__base[uVar34], pSVar3 == (Super_Gate_t *)0x0))
                        goto LAB_0037852f;
                        if (uVar34 != uVar33 && uVar34 != uVar36) break;
LAB_003785a8:
                        uVar34 = uVar34 + 1;
                      }
                      fVar40 = pSVar3->Area + fVar39;
                      if ((pMan->tAreaMax <= 0.0) || (fVar40 <= pMan->tAreaMax)) {
                        local_108 = pSVar3->uTruth[0];
                        local_104 = pSVar3->uTruth[1];
                        ptPinDelays[2] = pSVar3->ptDelays;
                        uVar27 = 0;
                        local_188 = CONCAT44(local_188._4_4_,fVar40);
                        fVar39 = local_140;
                        local_190 = uVar34;
                        pSupers[2] = pSVar3;
                        do {
                          if ((uVar27 == uVar28) ||
                             (pSVar3 = (Super_Gate_t *)__base[uVar27], pSVar3 == (Super_Gate_t *)0x0
                             )) goto LAB_003785a8;
                          if ((uVar27 != uVar34) && ((uVar27 != uVar36 && (uVar27 != uVar33)))) {
                            fVar41 = pSVar3->Area + fVar40;
                            if ((0.0 < pMan->tAreaMax) &&
                               (fVar39 = local_140, pMan->tAreaMax < fVar41)) goto LAB_003785a8;
                            local_100 = pSVar3->uTruth[0];
                            local_fc = pSVar3->uTruth[1];
                            ptPinDelays[3] = pSVar3->ptDelays;
                            uVar21 = 0;
                            local_180 = uVar27;
                            pSupers[3] = pSVar3;
                            while( true ) {
                              fVar39 = local_140;
                              if ((uVar21 == uVar28) ||
                                 (pSVar3 = (Super_Gate_t *)__base[uVar21],
                                 pSVar3 == (Super_Gate_t *)0x0)) goto LAB_003789ef;
                              if ((uVar21 != uVar27) &&
                                 (((uVar21 != uVar34 && (uVar21 != uVar36)) && (uVar21 != uVar33))))
                              break;
LAB_003789a1:
                              uVar21 = uVar21 + 1;
                            }
                            if (iVar8 == 0) {
                              local_170 = uVar21;
                              iVar8 = Super_CheckTimeout(local_128,pMan);
                              local_148 = pSVar3->Area + fVar41;
                              uVar27 = local_180;
                              uVar36 = local_158;
                              uVar33 = local_160;
                              uVar34 = local_190;
                              fVar38 = (float)local_130;
                              fVar40 = (float)local_188;
                              if ((pMan->tAreaMax <= 0.0) ||
                                 (fVar39 = local_140, local_1b0 <= pMan->tAreaMax)) {
                                local_f8 = pSVar3->uTruth[0];
                                local_f4 = pSVar3->uTruth[1];
                                ptPinDelays[4] = pSVar3->ptDelays;
                                uVar29 = 0;
                                uVar21 = local_170;
                                pSupers[4] = pSVar3;
                                do {
                                  uVar17 = local_178;
                                  if ((uVar28 == uVar29) ||
                                     (pSVar3 = (Super_Gate_t *)__base[uVar29],
                                     pSVar3 == (Super_Gate_t *)0x0)) goto LAB_003789a1;
                                  if ((uVar21 != uVar29) &&
                                     ((((uVar27 != uVar29 && (uVar34 != uVar29)) &&
                                       (uVar36 != uVar29)) && (uVar33 != uVar29)))) {
                                    if (iVar8 != 0) goto LAB_00378a57;
                                    iVar8 = Super_CheckTimeout(local_128,pMan);
                                    ppMVar31 = local_138;
                                    local_1b0 = pSVar3->Area + local_148;
                                    if ((0.0 < pMan->tAreaMax) && (pMan->tAreaMax < local_1b0)) {
                                      uVar21 = local_170;
                                      uVar27 = local_180;
                                      uVar36 = local_158;
                                      uVar33 = local_160;
                                      uVar34 = local_190;
                                      uVar17 = local_178;
                                      fVar38 = (float)local_130;
                                      fVar40 = (float)local_188;
                                      goto LAB_003789a1;
                                    }
                                    local_f0 = pSVar3->uTruth[0];
                                    local_ec = pSVar3->uTruth[1];
                                    ptPinDelays[5] = pSVar3->ptDelays;
                                    pSupers[5] = pSVar3;
                                    Mio_DeriveGateDelays
                                              (local_138[lVar30],ptPinDelays,6,pMan->nVarsMax,
                                               -9999.0,tPinDelaysRes,&tPinDelayMax);
                                    Mio_DeriveTruthTable
                                              (ppMVar31[lVar30],&local_118,6,pMan->nVarsMax,uTruth);
                                    iVar9 = Super_CompareGates(pMan,uTruth,local_1b0,tPinDelaysRes,
                                                               pMan->nVarsMax);
                                    if (iVar9 != 0) {
                                      pSVar16 = Super_CreateGateNew(pMan,ppMVar31[lVar30],pSupers,6,
                                                                    uTruth,local_1b0,tPinDelaysRes,
                                                                    tPinDelayMax,pMan->nVarsMax);
                                      Super_AddGateToTable(pMan,pSVar16);
                                      if (local_144 != 0) {
                                        uVar21 = local_170;
                                        uVar27 = local_180;
                                        __base = local_150;
                                        uVar36 = local_158;
                                        uVar33 = local_160;
                                        uVar34 = local_190;
                                        uVar28 = local_168;
                                        fVar38 = (float)local_130;
                                        fVar40 = (float)local_188;
                                        if (pMan->nClasses <= (int)local_144) goto LAB_00378990;
                                        goto LAB_00378a57;
                                      }
                                    }
                                    uVar21 = local_170;
                                    uVar27 = local_180;
                                    __base = local_150;
                                    uVar36 = local_158;
                                    uVar33 = local_160;
                                    uVar34 = local_190;
                                    uVar28 = local_168;
                                    fVar38 = (float)local_130;
                                    fVar40 = (float)local_188;
                                  }
LAB_00378990:
                                  uVar29 = uVar29 + 1;
                                } while( true );
                              }
                            }
                            else {
                              iVar8 = 1;
                            }
                          }
LAB_003789ef:
                          uVar27 = uVar27 + 1;
                        } while( true );
                      }
                    }
LAB_0037852f:
                    uVar33 = uVar33 + 1;
                  } while( true );
                }
              }
              break;
            }
          }
          else {
            iVar9 = Mio_GateReadPinNum(local_138[lVar30]);
            iVar8 = 0;
            if (iVar9 < 4) goto LAB_00377473;
          }
          lVar30 = lVar30 + 1;
        }
LAB_00378a57:
        Extra_ProgressBarStop(local_128);
        free(__base);
        pMan->nLevels = uVar35;
        if (fVerbose != 0) {
          iVar8 = 0x7e2742;
          printf("Lev %d: Try =%12d. Add =%6d. Rem =%5d. Save =%6d. Lookups =%12d. Aliases =%12d. ",
                 (ulong)uVar35,(ulong)(uint)pMan->nTried);
          Abc_Print(iVar8,"%s =","Time");
          aVar20 = Abc_Clock();
          Abc_Print(iVar8,"%9.2f sec\n",SUB84((double)(aVar20 - aVar18) / 1000000.0,0));
          fflush(_stdout);
        }
        uVar35 = uVar35 + 1;
      }
      aVar18 = Abc_Clock();
      pMan->Time = aVar18 - aVar14;
      if (fVerbose != 0) {
        puts("Writing the output file...");
        fflush(_stdout);
      }
      if (pMan->nGates < 1) {
        puts("The generated library is empty. No output file written.");
        pVVar24 = (Vec_Str_t *)0x0;
        ppMVar31 = local_138;
      }
      else {
        free(pMan->pGates);
        ppSVar15 = (Super_Gate_t_conflict **)malloc((long)pMan->nAdded << 3);
        pMan->pGates = ppSVar15;
        pMan->nGates = 0;
        psVar19 = stmm_init_gen(pMan->tTable);
        while (iVar8 = stmm_gen(psVar19,(char **)ptPinDelays,(char **)pSupers), ppSVar15 = pSupers,
              iVar8 != 0) {
          while (pSVar16 = *ppSVar15, pSVar16 != (Super_Gate_t_conflict *)0x0) {
            if (pSVar16->pRoot != (Mio_Gate_t *)0x0) {
              uVar36 = 0;
              uVar28 = (ulong)(uint)pMan->nVarsMax;
              if (pMan->nVarsMax < 1) {
                uVar28 = uVar36;
              }
              bVar6 = false;
              for (; uVar28 != uVar36; uVar36 = uVar36 + 1) {
                bVar7 = true;
                if ((-9998.999 <= pSVar16->ptDelays[uVar36]) && (bVar7 = false, bVar6))
                goto LAB_00378c33;
                bVar6 = bVar7;
              }
              iVar8 = pMan->nGates;
              pMan->nGates = iVar8 + 1;
              pMan->pGates[iVar8] = pSVar16;
            }
LAB_00378c33:
            ppSVar15 = &pSVar16->pNext;
          }
        }
        stmm_free_gen(psVar19);
        aVar14 = Abc_Clock();
        qsort(pMan->pGates,(long)pMan->nGates,8,Super_WriteCompare);
        ppSVar15 = pMan->pGates;
        iVar8 = Super_WriteCompare(ppSVar15,ppSVar15 + (long)pMan->nGates + -1);
        ppMVar31 = local_138;
        iVar9 = (int)ppSVar15;
        if (0 < iVar8) {
          __assert_fail("Super_WriteCompare( pMan->pGates, pMan->pGates + pMan->nGates - 1 ) <= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/super/superGate.c"
                        ,0x402,"Vec_Str_t *Super_Write(Super_Man_t *)");
        }
        if (pMan->fVerbose != 0) {
          Abc_Print(iVar9,"%s =","Sorting");
          aVar18 = Abc_Clock();
          Abc_Print(iVar9,"%9.2f sec\n",SUB84((double)(aVar18 - aVar14) / 1000000.0,0));
        }
        aVar14 = Abc_Clock();
        if (pMan->fWriteOldFormat != 0) {
          pcVar13 = (char *)malloc(10000);
          pcVar22 = Extra_FileNameGeneric(pMan->pName);
          sprintf(pcVar13,"%s.super_old",pcVar22);
          free(pcVar22);
          pMan->nUnique = 1;
          uVar37 = pMan->nGates;
          uVar28 = (ulong)uVar37;
          if ((int)uVar37 < 1) {
            uVar28 = 0;
          }
          iVar8 = 1;
          uVar36 = 0;
          while (uVar17 = uVar36 + 1, uVar17 - uVar28 != 1) {
            pSVar16 = pMan->pGates[uVar36];
            if ((pSVar16 == (Super_Gate_t_conflict *)0x0) || (uVar17 - (uVar37 - 1) == 1)) break;
            pSVar4 = pMan->pGates[uVar17];
            uVar36 = uVar17;
            if ((pSVar4->uTruth[0] != pSVar16->uTruth[0]) ||
               (pSVar4->uTruth[1] != pSVar16->uTruth[1])) {
              iVar8 = iVar8 + 1;
              pMan->nUnique = iVar8;
            }
          }
          __s = fopen(pcVar13,"w");
          fwrite("#\n",2,1,__s);
          pcVar22 = pMan->pName;
          uVar28 = 0;
          pcVar23 = Extra_TimeStamp();
          fprintf(__s,"# Supergate library derived for \"%s\" on %s.\n",pcVar22,pcVar23);
          fwrite("#\n",2,1,__s);
          pcVar22 = "";
          if (pMan->fSkipInv == 0) {
            pcVar22 = "-s";
          }
          fprintf(__s,"# Command line: \"super -I %d -L %d -N %d -T %d -D %.2f -A %.2f %s %s\".\n",
                  SUB84((double)pMan->tDelayMax,0),(double)pMan->tAreaMax,
                  (ulong)(uint)pMan->nVarsMax,(ulong)(uint)pMan->nLevels,
                  (ulong)(uint)pMan->nGatesMax,(ulong)(uint)pMan->TimeLimit,pcVar22,pMan->pName);
          fwrite("#\n",2,1,__s);
          fprintf(__s,"# The number of inputs      = %10d.\n",(ulong)(uint)pMan->nVarsMax);
          fprintf(__s,"# The number of levels      = %10d.\n",(ulong)(uint)pMan->nLevels);
          fprintf(__s,"# The maximum delay         = %10.2f.\n",SUB84((double)pMan->tDelayMax,0));
          fprintf(__s,"# The maximum area          = %10.2f.\n",SUB84((double)pMan->tAreaMax,0));
          fprintf(__s,"# The maximum runtime (sec) = %10d.\n",(ulong)(uint)pMan->TimeLimit);
          fwrite("#\n",2,1,__s);
          fprintf(__s,"# The number of attempts    = %10d.\n",(ulong)(uint)pMan->nTried);
          fprintf(__s,"# The number of supergates  = %10d.\n",(ulong)(uint)pMan->nGates);
          fprintf(__s,"# The number of functions   = %10d.\n",(ulong)(uint)pMan->nUnique);
          dVar5 = ldexp(1.0,pMan->nMints);
          fprintf(__s,"# The total functions       = %.0f (2^%d).\n",SUB84(dVar5,0),
                  (ulong)(uint)pMan->nMints);
          fwrite("#\n",2,1,__s);
          fprintf(__s,"# Generation time           = %10.2f sec.\n",
                  SUB84((double)((float)pMan->Time / 1e+06),0));
          fwrite("#\n",2,1,__s);
          fprintf(__s,"%s\n",pMan->pName);
          fprintf(__s,"%d\n",(ulong)(uint)pMan->nVarsMax);
          fprintf(__s,"%d\n",(ulong)(uint)pMan->nGates);
          while( true ) {
            iVar8 = pMan->nGates;
            if (((long)iVar8 <= (long)uVar28) ||
               (pSVar16 = pMan->pGates[uVar28], pSVar16 == (Super_Gate_t_conflict *)0x0))
            goto LAB_00379066;
            Super_WriteLibraryGate((FILE *)__s,pMan,pSVar16,(int)uVar28 + 1);
            iVar8 = pMan->nGates;
            if (uVar28 == iVar8 - 1) break;
            if ((pMan->pGates[uVar28 + 1]->uTruth[0] != pSVar16->uTruth[0]) ||
               (pMan->pGates[uVar28 + 1]->uTruth[1] != pSVar16->uTruth[1])) {
              fputc(10,__s);
            }
            uVar28 = uVar28 + 1;
          }
          uVar28 = (ulong)((int)uVar28 + 1);
LAB_00379066:
          if ((int)uVar28 != iVar8) {
            __assert_fail("Counter == pMan->nGates",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/super/superGate.c"
                          ,0x500,"void Super_WriteLibrary(Super_Man_t *)");
          }
          fclose(__s);
          if (pMan->fVerbose != 0) {
            printf("The supergates are written using old format \"%s\" ",pcVar13);
            iVar8 = Extra_FileSize(pcVar13);
            printf("(%0.3f MB).\n",SUB84((double)iVar8 * 9.5367431640625e-07,0));
          }
          free(pcVar13);
          iVar9 = (int)pcVar13;
          ppMVar31 = local_138;
        }
        if (pMan->fVerbose != 0) {
          Abc_Print(iVar9,"%s =","Writing old format");
          aVar18 = Abc_Clock();
          Abc_Print(iVar9,"%9.2f sec\n",SUB84((double)(aVar18 - aVar14) / 1000000.0,0));
        }
        aVar14 = Abc_Clock();
        pSVar32 = pMan;
        pVVar24 = Super_WriteLibraryTreeStr(pMan);
        iVar8 = (int)pSVar32;
        if (pMan->fVerbose != 0) {
          Abc_Print(iVar8,"%s =","Writing new format");
          aVar18 = Abc_Clock();
          Abc_Print(iVar8,"%9.2f sec\n",SUB84((double)(aVar18 - aVar14) / 1000000.0,0));
        }
      }
      Super_ManStop(pMan);
      free(ppMVar31);
    }
  }
  return pVVar24;
LAB_00378a42:
  uVar36 = uVar36 + 1;
  goto LAB_003784a1;
LAB_0037819d:
  uVar36 = uVar36 + 1;
  goto LAB_00377e2c;
LAB_003779b3:
  uVar36 = uVar36 + 1;
  goto LAB_0037779b;
}

Assistant:

Vec_Str_t * Super_PrecomputeStr( Mio_Library_t * pLibGen, int nVarsMax, int nLevels, int nGatesMax, float tDelayMax, float tAreaMax, int TimeLimit, int fSkipInv, int fVerbose )
{
    Vec_Str_t * vStr;
    Super_Man_t * pMan;
    Mio_Gate_t ** ppGates;
    int nGates, Level;
    abctime clk, clockStart;

    assert( nVarsMax < 7 );
    if ( nGatesMax && nGatesMax < nVarsMax )
    {
        fprintf( stderr, "Erro! The number of supergates requested (%d) in less than the number of variables (%d).\n", nGatesMax, nVarsMax );
        fprintf( stderr, "The library cannot be computed.\n" );
        return NULL;
    }

    // get the root gates
    ppGates = Mio_CollectRoots( pLibGen, nVarsMax, tDelayMax, 0, &nGates, fVerbose );
    if ( nGatesMax && nGates >= nGatesMax )
    {
        fprintf( stdout, "Warning! Genlib library contains more gates than can be computed.\n");
        fprintf( stdout, "Only one-gate supergates are included in the supergate library.\n" );
    }

    // start the manager
    pMan = Super_ManStart();
    pMan->pName     = Mio_LibraryReadName(pLibGen);
    pMan->nGatesMax = nGatesMax;
    pMan->fSkipInv  = fSkipInv;
    pMan->tDelayMax = tDelayMax;
    pMan->tAreaMax  = tAreaMax;
    pMan->TimeLimit = TimeLimit; // in seconds
    pMan->TimeStop  = TimeLimit ? TimeLimit * CLOCKS_PER_SEC + Abc_Clock() : 0; // in CPU ticks
    pMan->fVerbose  = fVerbose;

    if ( nGates == 0 )
    {
        fprintf( stderr, "Error: No genlib gates satisfy the limits criteria. Stop.\n");
        fprintf( stderr, "Limits: max delay =  %.2f, max area =  %.2f, time limit = %d sec.\n", 
            pMan->tDelayMax, pMan->tAreaMax, pMan->TimeLimit );

        // stop the manager
        Super_ManStop( pMan );
        ABC_FREE( ppGates );

        return NULL;
    }

    // get the starting supergates
    Super_First( pMan, nVarsMax );

    // perform the computation of supergates
    clockStart = Abc_Clock();
if ( fVerbose )
{
    printf( "Computing supergates with %d inputs, %d levels, and %d max gates.\n", 
        pMan->nVarsMax, nLevels, nGatesMax );
    printf( "Limits: max delay =  %.2f, max area =  %.2f, time limit = %d sec.\n", 
        pMan->tDelayMax, pMan->tAreaMax, pMan->TimeLimit );
}

    for ( Level = 1; Level <= nLevels; Level++ )
    {
        if ( pMan->TimeStop && Abc_Clock() > pMan->TimeStop )
            break;
clk = Abc_Clock();
        Super_Compute( pMan, ppGates, nGates, nGatesMax, fSkipInv );
        pMan->nLevels = Level;
if ( fVerbose )
{
        printf( "Lev %d: Try =%12d. Add =%6d. Rem =%5d. Save =%6d. Lookups =%12d. Aliases =%12d. ",
           Level, pMan->nTried, pMan->nAdded, pMan->nRemoved, pMan->nAdded - pMan->nRemoved, pMan->nLookups, pMan->nAliases );
ABC_PRT( "Time", Abc_Clock() - clk );
fflush( stdout );
}
    }
    pMan->Time = Abc_Clock() - clockStart;

if ( fVerbose )
{
printf( "Writing the output file...\n" );
fflush( stdout );
}
    // write them into a file
    vStr = Super_Write( pMan );

    // stop the manager
    Super_ManStop( pMan );
    ABC_FREE( ppGates );
    return vStr;
}